

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void duckdb::RLEFilter<duckdb::hugeint_t>
               (ColumnSegment *segment,ColumnScanState *state,idx_t vector_count,Vector *result,
               SelectionVector *sel,idx_t *sel_count,TableFilter *filter,
               TableFilterState *filter_state)

{
  char cVar1;
  uint uVar2;
  _func_int *p_Var3;
  undefined8 uVar4;
  pointer pSVar5;
  _func_int **pp_Var6;
  long lVar7;
  ulong uVar8;
  InternalException *this;
  _func_int **pp_Var9;
  ulong uVar10;
  data_ptr_t pdVar11;
  _func_int **pp_Var12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  _func_int **pp_Var16;
  idx_t iVar17;
  data_ptr_t pdVar18;
  _func_int *dataptr;
  SelectionVector matching_sel;
  SelectionVector run_matches;
  Vector run_vector;
  undefined1 local_110 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  SelectionVector local_c8;
  LogicalType local_b0;
  undefined1 local_98 [8];
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psStack_90;
  undefined1 local_88 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pSVar5 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar5 + 3));
  p_Var3 = pSVar5[3]._vptr_SegmentScanState[2];
  iVar17 = segment->offset;
  dataptr = p_Var3 + iVar17 + 8;
  uVar2 = *(uint *)&pSVar5[6]._vptr_SegmentScanState;
  if (pSVar5[7]._vptr_SegmentScanState == (_func_int **)0x0) {
    pp_Var16 = (_func_int **)((ulong)uVar2 - 8 >> 4);
    pp_Var6 = (_func_int **)operator_new__((ulong)pp_Var16);
    pSVar5[7]._vptr_SegmentScanState = pp_Var6;
    switchD_00569a20::default(pp_Var6,0,(size_t)pp_Var16);
    LogicalType::LogicalType(&local_b0,&result->type);
    Vector::Vector((Vector *)local_98,&local_b0,(data_ptr_t)dataptr);
    LogicalType::~LogicalType(&local_b0);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_110);
    Vector::ToUnifiedFormat((Vector *)local_98,(idx_t)pp_Var16,(UnifiedVectorFormat *)local_110);
    local_c8.sel_vector = (sel_t *)0x0;
    local_c8.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_c8.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pSVar5[8]._vptr_SegmentScanState = pp_Var16;
    ColumnSegment::FilterSelection
              (&local_c8,(Vector *)local_98,(UnifiedVectorFormat *)local_110,filter,filter_state,
               (idx_t)pp_Var16,(idx_t *)(pSVar5 + 8));
    pp_Var6 = pSVar5[8]._vptr_SegmentScanState;
    if (pp_Var6 != (_func_int **)0x0) {
      pp_Var16 = pSVar5[7]._vptr_SegmentScanState;
      pp_Var9 = (_func_int **)0x0;
      do {
        pp_Var12 = pp_Var9;
        if (local_c8.sel_vector != (sel_t *)0x0) {
          pp_Var12 = (_func_int **)(ulong)local_c8.sel_vector[(long)pp_Var9];
        }
        *(undefined1 *)((long)pp_Var16 + (long)pp_Var12) = 1;
        pp_Var9 = (_func_int **)((long)pp_Var9 + 1);
      } while (pp_Var6 != pp_Var9);
    }
    if (local_c8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0._M_pi);
    }
    if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0._M_pi);
    }
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
    if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
    }
    if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)&psStack_90);
  }
  if (pSVar5[8]._vptr_SegmentScanState == (_func_int **)0x0) {
    *sel_count = 0;
  }
  else {
    lVar7 = iVar17 + uVar2;
    pdVar18 = result->data;
    Vector::SetVectorType(result,FLAT_VECTOR);
    SelectionVector::SelectionVector((SelectionVector *)local_110,*sel_count);
    uVar15 = *sel_count;
    if (sel->sel_vector == (sel_t *)0x0) {
      if (uVar15 != 0) {
        pp_Var6 = pSVar5[4]._vptr_SegmentScanState;
        pp_Var16 = pSVar5[5]._vptr_SegmentScanState;
        iVar17 = 0;
        uVar14 = 0;
LAB_0058512a:
        uVar8 = (long)(ulong)*(ushort *)(p_Var3 + (long)pp_Var6 * 2 + lVar7) - (long)pp_Var16;
        uVar10 = uVar15 - uVar14;
        local_98 = *(undefined1 (*) [8])(dataptr + (long)pp_Var6 * 0x10);
        psStack_90 = *(shared_ptr<duckdb::ExtraTypeInfo,_true> **)
                      (dataptr + (long)pp_Var6 * 0x10 + 8);
        cVar1 = *(char *)((long)pSVar5[7]._vptr_SegmentScanState + (long)pp_Var6);
        if (uVar8 <= uVar10) goto code_r0x00585160;
        if ((uVar15 != uVar14) && (cVar1 != '\0')) {
          pdVar18 = pdVar18 + uVar14 * 0x10;
          do {
            *(undefined1 (*) [8])pdVar18 = local_98;
            *(shared_ptr<duckdb::ExtraTypeInfo,_true> **)(pdVar18 + 8) = psStack_90;
            *(sel_t *)((long)(sel_t **)local_110._0_8_ + iVar17 * 4) = (sel_t)uVar14;
            iVar17 = iVar17 + 1;
            uVar14 = uVar14 + 1;
            pdVar18 = pdVar18 + 0x10;
          } while (uVar15 != uVar14);
          pp_Var16 = pSVar5[5]._vptr_SegmentScanState;
        }
        pSVar5[5]._vptr_SegmentScanState = (_func_int **)((long)pp_Var16 + uVar10);
        goto LAB_00585204;
      }
      iVar17 = 0;
    }
    else {
      if (uVar15 == 0) {
        iVar17 = 0;
        uVar15 = 0;
      }
      else {
        uVar8 = 0;
        iVar17 = 0;
        uVar14 = 0;
        do {
          uVar15 = uVar8;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar15 = (ulong)sel->sel_vector[uVar8];
          }
          uVar10 = uVar15 - uVar14;
          if (uVar15 < uVar14) {
            this = (InternalException *)__cxa_allocate_exception(0x10);
            local_98 = (undefined1  [8])local_88;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_98,
                       "Error in RLEFilter - selection vector indices are not ordered","");
            InternalException::InternalException(this,(string *)local_98);
            __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pp_Var6 = pSVar5[4]._vptr_SegmentScanState;
          if (uVar10 != 0) {
            pp_Var16 = pSVar5[5]._vptr_SegmentScanState;
            do {
              uVar14 = (long)(ulong)*(ushort *)(p_Var3 + (long)pp_Var6 * 2 + lVar7) - (long)pp_Var16
              ;
              if (uVar10 < uVar14) {
                uVar14 = uVar10;
              }
              pp_Var16 = (_func_int **)((long)pp_Var16 + uVar14);
              if ((_func_int **)(ulong)*(ushort *)(p_Var3 + (long)pp_Var6 * 2 + lVar7) <= pp_Var16)
              {
                pp_Var6 = (_func_int **)((long)pp_Var6 + 1);
                pSVar5[4]._vptr_SegmentScanState = pp_Var6;
                pp_Var16 = (_func_int **)0x0;
              }
              uVar10 = uVar10 - uVar14;
            } while (uVar10 != 0);
            pSVar5[5]._vptr_SegmentScanState = pp_Var16;
          }
          if (*(char *)((long)pSVar5[7]._vptr_SegmentScanState + (long)pp_Var6) == '\x01') {
            uVar4 = *(undefined8 *)(dataptr + (long)pp_Var6 * 0x10 + 8);
            *(undefined8 *)(pdVar18 + uVar15 * 0x10) =
                 *(undefined8 *)(dataptr + (long)pp_Var6 * 0x10);
            *(undefined8 *)(pdVar18 + uVar15 * 0x10 + 8) = uVar4;
            *(sel_t *)((long)(sel_t **)local_110._0_8_ + iVar17 * 4) = (sel_t)uVar15;
            iVar17 = iVar17 + 1;
          }
          uVar8 = uVar8 + 1;
          uVar14 = uVar15;
        } while (uVar8 < *sel_count);
      }
      uVar15 = vector_count - uVar15;
      if (uVar15 != 0) {
        pp_Var6 = pSVar5[4]._vptr_SegmentScanState;
        pp_Var16 = pSVar5[5]._vptr_SegmentScanState;
        do {
          uVar14 = (long)(ulong)*(ushort *)(p_Var3 + (long)pp_Var6 * 2 + lVar7) - (long)pp_Var16;
          if (uVar15 < uVar14) {
            uVar14 = uVar15;
          }
          pp_Var16 = (_func_int **)((long)pp_Var16 + uVar14);
          if ((_func_int **)(ulong)*(ushort *)(p_Var3 + (long)pp_Var6 * 2 + lVar7) <= pp_Var16) {
            pp_Var6 = (_func_int **)((long)pp_Var6 + 1);
            pSVar5[4]._vptr_SegmentScanState = pp_Var6;
            pp_Var16 = (_func_int **)0x0;
          }
          uVar15 = uVar15 - uVar14;
        } while (uVar15 != 0);
        pSVar5[5]._vptr_SegmentScanState = pp_Var16;
      }
    }
LAB_00585204:
    if (iVar17 != *sel_count) {
      shared_ptr<duckdb::SelectionData,_true>::operator=
                (&sel->selection_data,(shared_ptr<duckdb::SelectionData,_true> *)(local_110 + 8));
      sel->sel_vector = (sel_t *)local_110._0_8_;
      *sel_count = iVar17;
    }
    if (local_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100._M_pi);
    }
  }
  return;
code_r0x00585160:
  if (((_func_int **)(ulong)*(ushort *)(p_Var3 + (long)pp_Var6 * 2 + lVar7) != pp_Var16) &&
     (cVar1 != '\0')) {
    pdVar11 = pdVar18 + uVar14 * 0x10;
    uVar13 = uVar14 & 0xffffffff;
    uVar10 = uVar8;
    do {
      *(undefined1 (*) [8])pdVar11 = local_98;
      *(shared_ptr<duckdb::ExtraTypeInfo,_true> **)(pdVar11 + 8) = psStack_90;
      *(sel_t *)((long)(sel_t **)local_110._0_8_ + iVar17 * 4) = (sel_t)uVar13;
      iVar17 = iVar17 + 1;
      uVar13 = (ulong)((sel_t)uVar13 + 1);
      pdVar11 = pdVar11 + 0x10;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
    pp_Var6 = pSVar5[4]._vptr_SegmentScanState;
  }
  uVar14 = uVar14 + uVar8;
  pp_Var6 = (_func_int **)((long)pp_Var6 + 1);
  pSVar5[4]._vptr_SegmentScanState = pp_Var6;
  pSVar5[5]._vptr_SegmentScanState = (_func_int **)0x0;
  pp_Var16 = (_func_int **)0x0;
  if (uVar15 <= uVar14) goto LAB_00585204;
  goto LAB_0058512a;
}

Assistant:

void RLEFilter(ColumnSegment &segment, ColumnScanState &state, idx_t vector_count, Vector &result, SelectionVector &sel,
               idx_t &sel_count, const TableFilter &filter, TableFilterState &filter_state) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	auto total_run_count = (scan_state.rle_count_offset - RLEConstants::RLE_HEADER_SIZE) / sizeof(T);
	if (!scan_state.matching_runs) {
		// we haven't applied the filter yet
		// apply the filter to all RLE values at once

		// initialize the filter set to all false (all runs are filtered out)
		scan_state.matching_runs = make_unsafe_uniq_array<bool>(total_run_count);
		memset(scan_state.matching_runs.get(), 0, sizeof(bool) * total_run_count);

		// execute the filter over all runs at once
		Vector run_vector(result.GetType(), data_ptr_cast(data_pointer));

		UnifiedVectorFormat run_format;
		run_vector.ToUnifiedFormat(total_run_count, run_format);

		SelectionVector run_matches;
		scan_state.matching_run_count = total_run_count;
		ColumnSegment::FilterSelection(run_matches, run_vector, run_format, filter, filter_state, total_run_count,
		                               scan_state.matching_run_count);

		// for any runs that pass the filter - set the matches to true
		for (idx_t i = 0; i < scan_state.matching_run_count; i++) {
			auto idx = run_matches.get_index(i);
			scan_state.matching_runs[idx] = true;
		}
	}
	if (scan_state.matching_run_count == 0) {
		// early-out, no runs match the filter so the filter can never pass
		sel_count = 0;
		return;
	}
	// scan (the subset of) the matching runs AND set the output selection vector with the rows that match
	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t matching_count = 0;
	SelectionVector matching_sel(sel_count);
	if (!sel.IsSet()) {
		// no selection vector yet - fast path
		// this is essentially the normal scan, but we apply the filter and fill the selection vector
		idx_t result_offset = 0;
		idx_t result_end = sel_count;
		while (result_offset < result_end) {
			rle_count_t run_end = index_pointer[scan_state.entry_pos];
			idx_t run_count = run_end - scan_state.position_in_entry;
			idx_t remaining_scan_count = result_end - result_offset;
			// the run is scanned - scan it
			T element = data_pointer[scan_state.entry_pos];
			if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
				if (scan_state.matching_runs[scan_state.entry_pos]) {
					for (idx_t i = 0; i < remaining_scan_count; i++) {
						result_data[result_offset + i] = element;
						matching_sel.set_index(matching_count++, result_offset + i);
					}
				}
				scan_state.position_in_entry += remaining_scan_count;
				break;
			}

			if (scan_state.matching_runs[scan_state.entry_pos]) {
				for (idx_t i = 0; i < run_count; i++) {
					result_data[result_offset + i] = element;
					matching_sel.set_index(matching_count++, result_offset + i);
				}
			}

			result_offset += run_count;
			scan_state.ForwardToNextRun();
		}
	} else {
		// we already have a selection applied - this is more complex since we need to merge it with our filter
		// use a simpler (but slower) approach
		idx_t prev_idx = 0;
		for (idx_t i = 0; i < sel_count; i++) {
			auto read_idx = sel.get_index(i);
			if (read_idx < prev_idx) {
				throw InternalException("Error in RLEFilter - selection vector indices are not ordered");
			}
			// skip forward to the next index
			scan_state.SkipInternal(index_pointer, read_idx - prev_idx);
			prev_idx = read_idx;
			if (!scan_state.matching_runs[scan_state.entry_pos]) {
				// this run is filtered out - we don't need to scan it
				continue;
			}
			// the run is not filtered out - read the element
			result_data[read_idx] = data_pointer[scan_state.entry_pos];
			matching_sel.set_index(matching_count++, read_idx);
		}
		// skip the tail
		scan_state.SkipInternal(index_pointer, vector_count - prev_idx);
	}

	// set up the filter result
	if (matching_count != sel_count) {
		sel.Initialize(matching_sel);
		sel_count = matching_count;
	}
}